

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Spc_File::load_(Spc_File *this,Data_Reader *in)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar3;
  uchar *puVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t __size;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar2;
  undefined4 extraout_var_00;
  
  iVar1 = (*in->_vptr_Data_Reader[4])(in);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 < 0x10180) {
    pcVar3 = "Wrong file type for this emulator";
  }
  else {
    iVar1 = (*in->_vptr_Data_Reader[3])(in,&this->header,0x100);
    pcVar3 = (char *)CONCAT44(extraout_var_00,iVar1);
    if (pcVar3 == (char *)0x0) {
      auVar6[0] = -((this->header).tag[0xb] == ' ');
      auVar6[1] = -((this->header).tag[0xc] == 'S');
      auVar6[2] = -((this->header).tag[0xd] == 'o');
      auVar6[3] = -((this->header).tag[0xe] == 'u');
      auVar6[4] = -((this->header).tag[0xf] == 'n');
      auVar6[5] = -((this->header).tag[0x10] == 'd');
      auVar6[6] = -((this->header).tag[0x11] == ' ');
      auVar6[7] = -((this->header).tag[0x12] == 'F');
      auVar6[8] = -((this->header).tag[0x13] == 'i');
      auVar6[9] = -((this->header).tag[0x14] == 'l');
      auVar6[10] = -((this->header).tag[0x15] == 'e');
      auVar6[0xb] = -((this->header).tag[0x16] == ' ');
      auVar6[0xc] = -((this->header).tag[0x17] == 'D');
      auVar6[0xd] = -((this->header).tag[0x18] == 'a');
      auVar6[0xe] = -((this->header).tag[0x19] == 't');
      auVar6[0xf] = -((this->header).tag[0x1a] == 'a');
      auVar5[0] = -((this->header).tag[0] == 'S');
      auVar5[1] = -((this->header).tag[1] == 'N');
      auVar5[2] = -((this->header).tag[2] == 'E');
      auVar5[3] = -((this->header).tag[3] == 'S');
      auVar5[4] = -((this->header).tag[4] == '-');
      auVar5[5] = -((this->header).tag[5] == 'S');
      auVar5[6] = -((this->header).tag[6] == 'P');
      auVar5[7] = -((this->header).tag[7] == 'C');
      auVar5[8] = -((this->header).tag[8] == '7');
      auVar5[9] = -((this->header).tag[9] == '0');
      auVar5[10] = -((this->header).tag[10] == '0');
      auVar5[0xb] = -((this->header).tag[0xb] == ' ');
      auVar5[0xc] = -((this->header).tag[0xc] == 'S');
      auVar5[0xd] = -((this->header).tag[0xd] == 'o');
      auVar5[0xe] = -((this->header).tag[0xe] == 'u');
      auVar5[0xf] = -((this->header).tag[0xf] == 'n');
      auVar5 = auVar5 & auVar6;
      if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = "Wrong file type for this emulator";
      }
      if (pcVar3 == (char *)0x0) {
        if (0x10200 < lVar2) {
          __size = lVar2 - 0x10200;
          puVar4 = (uchar *)realloc((this->xid6).begin_,__size);
          if (puVar4 == (uchar *)0x0 && __size != 0) {
            return "Out of memory";
          }
          (this->xid6).begin_ = puVar4;
          (this->xid6).size_ = __size;
          iVar1 = (*in->_vptr_Data_Reader[5])(in,0x10100);
          if ((blargg_err_t)CONCAT44(extraout_var_01,iVar1) != (blargg_err_t)0x0) {
            return (blargg_err_t)CONCAT44(extraout_var_01,iVar1);
          }
          iVar1 = (*in->_vptr_Data_Reader[3])(in,(this->xid6).begin_,(this->xid6).size_);
          if ((blargg_err_t)CONCAT44(extraout_var_02,iVar1) != (blargg_err_t)0x0) {
            return (blargg_err_t)CONCAT44(extraout_var_02,iVar1);
          }
        }
        pcVar3 = (char *)0x0;
      }
    }
  }
  return pcVar3;
}

Assistant:

blargg_err_t load_( Data_Reader& in )
	{
		long file_size = in.remain();
		if ( file_size < Snes_Spc::spc_min_file_size )
			return gme_wrong_file_type;
		RETURN_ERR( in.read( &header, Spc_Emu::header_size ) );
		RETURN_ERR( check_spc_header( header.tag ) );
		long const xid6_offset = 0x10200;
		long xid6_size = file_size - xid6_offset;
		if ( xid6_size > 0 )
		{
			RETURN_ERR( xid6.resize( xid6_size ) );
			RETURN_ERR( in.skip( xid6_offset - Spc_Emu::header_size ) );
			RETURN_ERR( in.read( xid6.begin(), (long)xid6.size() ) );
		}
		return 0;
	}